

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O0

void drawScene(void)

{
  undefined8 uStack_28;
  GLfloat model_shininess;
  GLfloat model_specular [4];
  GLfloat model_diffuse [4];
  
  model_specular[2] = 1.0;
  model_specular[3] = 0.8;
  uStack_28 = 0x3f19999a3f19999a;
  model_specular[0] = 0.6;
  model_specular[1] = 1.0;
  glPushMatrix();
  glRotatef((float)rot_x * 0.5,0x3f800000,0);
  glRotatef((float)rot_y * 0.5,0,0x3f800000);
  glRotatef((float)rot_z * 0.5,0,0,0x3f800000);
  glColor4fv(model_specular + 2);
  glMaterialfv(0x404,0x1201,model_specular + 2);
  glMaterialfv(0x404,0x1202,&stack0xffffffffffffffd8);
  glMaterialf(0x41a00000,0x404,0x1601);
  drawTorus();
  glPopMatrix();
  return;
}

Assistant:

static void drawScene(void)
{
    const GLfloat model_diffuse[4]  = {1.0f, 0.8f, 0.8f, 1.0f};
    const GLfloat model_specular[4] = {0.6f, 0.6f, 0.6f, 1.0f};
    const GLfloat model_shininess   = 20.0f;

    glPushMatrix();

    // Rotate the object
    glRotatef((GLfloat) rot_x * 0.5f, 1.0f, 0.0f, 0.0f);
    glRotatef((GLfloat) rot_y * 0.5f, 0.0f, 1.0f, 0.0f);
    glRotatef((GLfloat) rot_z * 0.5f, 0.0f, 0.0f, 1.0f);

    // Set model color (used for orthogonal views, lighting disabled)
    glColor4fv(model_diffuse);

    // Set model material (used for perspective view, lighting enabled)
    glMaterialfv(GL_FRONT, GL_DIFFUSE, model_diffuse);
    glMaterialfv(GL_FRONT, GL_SPECULAR, model_specular);
    glMaterialf(GL_FRONT, GL_SHININESS, model_shininess);

    // Draw torus
    drawTorus();

    glPopMatrix();
}